

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

int __thiscall
SocketInternals::Send
          (SocketInternals *this,uchar *bufsend,size_t msglen,EthDestType destType,uchar ip_offset)

{
  in_addr_t iVar1;
  ssize_t sVar2;
  ostream *poVar3;
  int *piVar4;
  char *pcVar5;
  int local_34;
  uint32_t s_addr_saved;
  int retval;
  uchar ip_offset_local;
  EthDestType destType_local;
  size_t msglen_local;
  uchar *bufsend_local;
  SocketInternals *this_local;
  
  if (destType == DEST_BROADCAST) {
    sVar2 = sendto(this->SocketFD,bufsend,msglen,0,(sockaddr *)&this->ServerAddrBroadcast,0x10);
    local_34 = (int)sVar2;
  }
  else if (destType == DEST_MULTICAST) {
    sVar2 = sendto(this->SocketFD,bufsend,msglen,0,(sockaddr *)&this->ServerAddrMulticast,0x10);
    local_34 = (int)sVar2;
  }
  else {
    iVar1 = (this->ServerAddr).sin_addr.s_addr;
    if (ip_offset != '\0') {
      (this->ServerAddr).sin_addr.s_addr =
           (uint)ip_offset * 0x1000000 + (this->ServerAddr).sin_addr.s_addr;
    }
    sVar2 = sendto(this->SocketFD,bufsend,msglen,0,(sockaddr *)&this->ServerAddr,0x10);
    local_34 = (int)sVar2;
    (this->ServerAddr).sin_addr.s_addr = iVar1;
  }
  if (local_34 == -1) {
    poVar3 = std::operator<<(this->outStr,"Send: failed to send: ");
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    poVar3 = std::operator<<(poVar3,pcVar5);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = -1;
  }
  else {
    if (local_34 != (int)msglen) {
      poVar3 = std::operator<<(this->outStr,"Send: failed to send the whole message");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

int SocketInternals::Send(const unsigned char *bufsend, size_t msglen, EthDestType destType, unsigned char ip_offset)
{
    int retval;
    if (destType == DEST_BROADCAST) {
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddrBroadcast), sizeof(ServerAddrBroadcast));
    }
    else if (destType == DEST_MULTICAST) {
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddrMulticast), sizeof(ServerAddrMulticast));
    }
    else {
        // Save base address (e.g., 169.254.0.100)
        uint32_t s_addr_saved = ServerAddr.sin_addr.s_addr;
        // Update IP address if needed (Firmware Rev 9+)
        if (ip_offset > 0)
            ServerAddr.sin_addr.s_addr += (ip_offset<<24);
        retval = sendto(SocketFD, reinterpret_cast<const char *>(bufsend), msglen, 0,
                        reinterpret_cast<struct sockaddr *>(&ServerAddr), sizeof(ServerAddr));
        // Restore base address
        ServerAddr.sin_addr.s_addr = s_addr_saved;
    }

    if (retval == SOCKET_ERROR) {
#ifdef _MSC_VER
        outStr << "Send: failed to send: " << WSAGetLastError() << std::endl;
#else
        outStr << "Send: failed to send: " << strerror(errno) << std::endl;
#endif
        return -1;
    }
    else if (retval != static_cast<int>(msglen)) {
        outStr << "Send: failed to send the whole message" << std::endl;
    }
    return retval;
}